

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meter.cc
# Opt level: O0

long __thiscall cppmetrics::Meter::get_count(Meter *this)

{
  Meter *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->m_count).super___atomic_base<long>._M_i;
}

Assistant:

long Meter::get_count() const noexcept
{
  return m_count.load();
}